

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

bool wasm::replaceChildWith(Expression *expr,Expression *with)

{
  Index *this;
  bool bVar1;
  byte bVar2;
  Iterator IVar3;
  bool local_12a;
  FindAll<wasm::Pop> local_f0;
  uintptr_t local_d8;
  uintptr_t local_d0;
  Expression **local_c8;
  Expression **child;
  Self *local_b8;
  Index local_b0;
  undefined1 local_a8 [8];
  Iterator __end1;
  undefined1 local_78 [8];
  Iterator __begin1;
  ChildIterator *__range1;
  Expression *with_local;
  Expression *expr_local;
  
  this = &__begin1.index;
  ChildIterator::ChildIterator((ChildIterator *)this,expr);
  IVar3 = AbstractChildIterator<wasm::ChildIterator>::begin
                    ((AbstractChildIterator<wasm::ChildIterator> *)this);
  __end1._8_8_ = IVar3.parent;
  __begin1.parent._0_4_ = IVar3.index;
  local_78 = (undefined1  [8])__end1._8_8_;
  IVar3 = AbstractChildIterator<wasm::ChildIterator>::end
                    ((AbstractChildIterator<wasm::ChildIterator> *)this);
  local_b8 = IVar3.parent;
  local_b0 = IVar3.index;
  local_a8 = (undefined1  [8])local_b8;
  __end1.parent._0_4_ = local_b0;
  do {
    bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                      ((Iterator *)local_78,(Iterator *)local_a8);
    if (!bVar1) {
      child._4_4_ = 2;
LAB_00210e4c:
      ChildIterator::~ChildIterator((ChildIterator *)&__begin1.index);
      if (child._4_4_ != 1) {
        expr_local._7_1_ = 0;
      }
      return (bool)(expr_local._7_1_ & 1);
    }
    local_c8 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*((Iterator *)local_78)
    ;
    local_d0 = (with->type).id;
    local_d8 = ((*local_c8)->type).id;
    bVar2 = wasm::Type::isSubType((Type)local_d0,(Type)local_d8);
    local_12a = false;
    if ((bVar2 & 1) != 0) {
      FindAll<wasm::Pop>::FindAll(&local_f0,*local_c8);
      local_12a = std::vector<wasm::Pop_*,_std::allocator<wasm::Pop_*>_>::empty(&local_f0.list);
      FindAll<wasm::Pop>::~FindAll(&local_f0);
    }
    if (local_12a != false) {
      *local_c8 = with;
      expr_local._7_1_ = 1;
      child._4_4_ = 1;
      goto LAB_00210e4c;
    }
    AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_78);
  } while( true );
}

Assistant:

static bool replaceChildWith(Expression* expr, Expression* with) {
  for (auto*& child : ChildIterator(expr)) {
    // To replace, we must have an appropriate type, and we cannot replace a
    // Pop under any circumstances.
    if (Type::isSubType(with->type, child->type) &&
        FindAll<Pop>(child).list.empty()) {
      child = with;
      return true;
    }
  }
  return false;
}